

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool gl4cts::Utils::isMatrixVariableType(_variable_type type)

{
  undefined1 local_d;
  _variable_type type_local;
  
  local_d = true;
  if (((((((type != VARIABLE_TYPE_MAT2) && (local_d = true, type != VARIABLE_TYPE_MAT3)) &&
         (local_d = true, type != VARIABLE_TYPE_MAT4)) &&
        ((local_d = true, type != VARIABLE_TYPE_MAT2X3 &&
         (local_d = true, type != VARIABLE_TYPE_MAT2X4)))) &&
       ((local_d = true, type != VARIABLE_TYPE_MAT3X2 &&
        ((local_d = true, type != VARIABLE_TYPE_MAT3X4 &&
         (local_d = true, type != VARIABLE_TYPE_MAT4X2)))))) &&
      (local_d = true, type != VARIABLE_TYPE_MAT4X3)) &&
     ((((local_d = true, type != VARIABLE_TYPE_DMAT2 &&
        (local_d = true, type != VARIABLE_TYPE_DMAT3)) &&
       (local_d = true, type != VARIABLE_TYPE_DMAT4)) &&
      (((local_d = true, type != VARIABLE_TYPE_DMAT2X3 &&
        (local_d = true, type != VARIABLE_TYPE_DMAT2X4)) &&
       ((local_d = true, type != VARIABLE_TYPE_DMAT3X2 &&
        ((local_d = true, type != VARIABLE_TYPE_DMAT3X4 &&
         (local_d = true, type != VARIABLE_TYPE_DMAT4X2)))))))))) {
    local_d = type == VARIABLE_TYPE_DMAT4X3;
  }
  return local_d;
}

Assistant:

bool Utils::isMatrixVariableType(_variable_type type)
{
	return (type == VARIABLE_TYPE_MAT2 || type == VARIABLE_TYPE_MAT3 || type == VARIABLE_TYPE_MAT4 ||
			type == VARIABLE_TYPE_MAT2X3 || type == VARIABLE_TYPE_MAT2X4 || type == VARIABLE_TYPE_MAT3X2 ||
			type == VARIABLE_TYPE_MAT3X4 || type == VARIABLE_TYPE_MAT4X2 || type == VARIABLE_TYPE_MAT4X3 ||
			type == VARIABLE_TYPE_DMAT2 || type == VARIABLE_TYPE_DMAT3 || type == VARIABLE_TYPE_DMAT4 ||
			type == VARIABLE_TYPE_DMAT2X3 || type == VARIABLE_TYPE_DMAT2X4 || type == VARIABLE_TYPE_DMAT3X2 ||
			type == VARIABLE_TYPE_DMAT3X4 || type == VARIABLE_TYPE_DMAT4X2 || type == VARIABLE_TYPE_DMAT4X3);
}